

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void __thiscall
TestSkipInternal::TestSkipInternal(TestSkipInternal *this,TestRegistry *r,string *name)

{
  pointer pcVar1;
  string local_50;
  
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_0016a498;
  (this->super_Test).m_success = true;
  (this->super_Test).m_skipped = false;
  (this->super_Test).m_name._M_dataplus._M_p = (pointer)&(this->super_Test).m_name.field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->super_Test).m_name,pcVar1,pcVar1 + name->_M_string_length);
  (this->super_Test).m_registry = r;
  testinator::TestRegistry::Register(r,&this->super_Test,name,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_0016ae08;
  return;
}

Assistant:

TestSkipInternal(testinator::TestRegistry& r, const string& name)
    : testinator::Test(r, name)
  {}